

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw_image.cxx
# Opt level: O0

void m565_converter(uchar *from,uchar *to,int w,int delta)

{
  uint local_34;
  int local_30;
  int r;
  int td;
  int d;
  unsigned_short *t;
  int delta_local;
  int w_local;
  uchar *to_local;
  uchar *from_local;
  
  if (dir == 0) {
    local_30 = 1;
    r = delta;
    _td = (short *)to;
    to_local = from;
  }
  else {
    to_local = from + (w + -1) * delta;
    _td = (short *)(to + (long)(w + -1) * 2);
    r = -delta;
    local_30 = -1;
  }
  dir = (int)(dir == 0);
  local_34 = ri;
  t._4_4_ = w;
  while (t._4_4_ != 0) {
    local_34 = (local_34 & 7) + (uint)*to_local;
    if (0xff < local_34) {
      local_34 = 0xff;
    }
    *_td = (short)((int)local_34 >> 3) * 0x841;
    to_local = to_local + r;
    _td = _td + local_30;
    t._4_4_ = t._4_4_ + -1;
  }
  ri = local_34;
  return;
}

Assistant:

static void m565_converter(const uchar *from,uchar *to,int w, int delta) {
  OUTTYPE *t = (OUTTYPE *)to;
  int d, td;
  if (dir) {
    dir = 0;
    from = from+(w-1)*delta;
    t = t+(w-1)*OUTSIZE;
    d = -delta;
    td = -OUTSIZE;
  } else {
    dir = 1;
    d = delta;
    td = OUTSIZE;
  }
  int r=ri;
  for (; w--; from += d, t += td) {
    r = (r&7) + *from; if (r > 255) r = 255;
    OUTASSIGN((r>>3) * 0x841);
  }
  ri = r;
}